

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O2

void __thiscall
FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor>::FileInfoWrapper
          (FileInfoWrapper<AS_02::JXS::MXFReader,_MyJXSDescriptor> *this,
          IFileReaderFactory *fileReaderFactory)

{
  UL *pUVar1;
  
  this->_vptr_FileInfoWrapper = (_func_int **)&PTR__FileInfoWrapper_00115c28;
  AS_02::JXS::MXFReader::MXFReader(&this->m_Reader,fileReaderFactory);
  (this->m_Desc).m_SampleRate.super_Rational.Numerator = 0;
  (this->m_Desc).m_SampleRate.super_Rational.Denominator = 0;
  (this->m_Desc).m_RGBADescriptor = (RGBAEssenceDescriptor *)0x0;
  (this->m_Desc).m_CDCIDescriptor = (CDCIEssenceDescriptor *)0x0;
  (this->m_Desc).m_JPEGXSSubDescriptor = (JPEGXSPictureSubDescriptor *)0x0;
  (this->m_Desc).ContainerDuration = 0;
  (this->m_Desc).m_SampleRate.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00115c58;
  (this->m_Desc).m_EditRate.super_Rational.Numerator = 0;
  (this->m_Desc).m_EditRate.super_Rational.Denominator = 0;
  (this->m_Desc).m_EditRate.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00115c58;
  ASDCP::WriterInfo::WriterInfo(&this->m_WriterInfo);
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_HasValue = false;
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[0] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[1] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[2] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[3] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[4] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[5] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[6] = '\0';
  pUVar1 = &this->m_PictureEssenceCoding;
  (pUVar1->super_Identifier<16U>).m_Value[7] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[8] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[9] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[10] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xb] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xc] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xd] = '\0';
  (pUVar1->super_Identifier<16U>).m_Value[0xe] = '\0';
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value[0xf] = '\0';
  this->m_MaxBitrate = 0.0;
  this->m_AvgBitrate = 0.0;
  (this->m_PictureEssenceCoding).super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00115ae8;
  return;
}

Assistant:

FileInfoWrapper(const IFileReaderFactory& fileReaderFactory) : m_MaxBitrate(0.0), m_AvgBitrate(0.0), m_Reader(fileReaderFactory) {}